

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::SocketTest_MockSocketHello_Test::TestBody(SocketTest_MockSocketHello_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  element_type *peVar4;
  const_reference pvVar5;
  size_type sVar6;
  char *in_R9;
  AssertHelper local_370;
  Message local_368;
  int local_360;
  int local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_6;
  Message local_340;
  size_type local_338;
  unsigned_long local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_5;
  undefined1 auStack_310 [4];
  int len;
  ByteArray *local_308;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_300;
  function<void_(short)> local_2f8;
  anon_class_24_3_3565f81d local_2d8;
  function<void_(short)> local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  unsigned_short local_28c;
  unsigned_short local_28a;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_4;
  Message local_270;
  Address local_268;
  Address local_250;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_3;
  Message local_220;
  unsigned_short local_214;
  unsigned_short local_212;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  Message local_1f8;
  Address local_1f0;
  Address local_1d8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_190;
  Message local_188;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  shared_ptr<ot::commissioner::MockSocket> local_110;
  Address local_100;
  undefined1 local_e8 [8];
  shared_ptr<ot::commissioner::MockSocket> serverSocket;
  undefined1 local_c0 [8];
  shared_ptr<ot::commissioner::MockSocket> clientSocket;
  Message local_a8;
  void *local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  event_base *eventBase;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  ByteArray kWorld;
  allocator<unsigned_char> local_3e;
  uchar local_3d [5];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  ByteArray kHello;
  SocketTest_MockSocketHello_Test *this_local;
  
  builtin_memcpy(local_3d,"hello",5);
  local_38 = local_3d;
  local_30 = 5;
  kHello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_3e);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l_00,&local_3e);
  std::allocator<unsigned_char>::~allocator(&local_3e);
  eventBase._3_1_ = 0x77;
  eventBase._4_1_ = 0x6f;
  eventBase._5_1_ = 0x72;
  eventBase._6_1_ = 0x6c;
  eventBase._7_1_ = 100;
  local_78 = (iterator)((long)&eventBase + 3);
  local_70 = 5;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&eventBase + 2));
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__l,
             (allocator<unsigned_char> *)((long)&eventBase + 2));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&eventBase + 2));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )event_base_new();
  local_a0 = (void *)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)local_98,"eventBase","nullptr",(event_base **)&gtest_ar.message_,&local_a0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &clientSocket.
                super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &clientSocket.
                super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &clientSocket.
                super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  Address::FromString((Address *)
                      &serverSocket.
                       super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(string *)kClientAddr_abi_cxx11_);
  std::
  make_shared<ot::commissioner::MockSocket,event_base*&,ot::commissioner::Address,unsigned_short&>
            ((event_base **)local_c0,(Address *)&gtest_ar.message_,
             (unsigned_short *)
             &serverSocket.
              super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Address::~Address((Address *)
                    &serverSocket.
                     super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  Address::FromString(&local_100,(string *)kServerAddr_abi_cxx11_);
  std::
  make_shared<ot::commissioner::MockSocket,event_base*&,ot::commissioner::Address,unsigned_short&>
            ((event_base **)local_e8,(Address *)&gtest_ar.message_,(unsigned_short *)&local_100);
  Address::~Address(&local_100);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  std::shared_ptr<ot::commissioner::MockSocket>::shared_ptr
            (&local_110,(shared_ptr<ot::commissioner::MockSocket> *)local_e8);
  MockSocket::Connect(peVar4,&local_110);
  std::shared_ptr<ot::commissioner::MockSocket>::~shared_ptr(&local_110);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  std::shared_ptr<ot::commissioner::MockSocket>::shared_ptr
            ((shared_ptr<ot::commissioner::MockSocket> *)&gtest_ar_.message_,
             (shared_ptr<ot::commissioner::MockSocket> *)local_c0);
  MockSocket::Connect(peVar4,(MockSocketPtr *)&gtest_ar_.message_);
  std::shared_ptr<ot::commissioner::MockSocket>::~shared_ptr
            ((shared_ptr<ot::commissioner::MockSocket> *)&gtest_ar_.message_);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  local_131 = Socket::IsConnected(&peVar4->super_Socket);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_130,
               (AssertionResult *)"clientSocket->IsConnected()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  local_179 = Socket::IsConnected(&peVar4->super_Socket);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_178,
               (AssertionResult *)"serverSocket->IsConnected()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  (*(peVar4->super_Socket)._vptr_Socket[5])(&local_1d8);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  (*(peVar4->super_Socket)._vptr_Socket[3])(&local_1f0);
  testing::internal::EqHelper::
  Compare<ot::commissioner::Address,_ot::commissioner::Address,_nullptr>
            ((EqHelper *)local_1c0,"clientSocket->GetPeerAddr()","serverSocket->GetLocalAddr()",
             &local_1d8,&local_1f0);
  Address::~Address(&local_1f0);
  Address::~Address(&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  iVar2 = (*(peVar4->super_Socket)._vptr_Socket[4])();
  local_212 = (unsigned_short)iVar2;
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  iVar2 = (*(peVar4->super_Socket)._vptr_Socket[2])();
  local_214 = (unsigned_short)iVar2;
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_210,"clientSocket->GetPeerPort()","serverSocket->GetLocalPort()",
             &local_212,&local_214);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  (*(peVar4->super_Socket)._vptr_Socket[3])(&local_250);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  (*(peVar4->super_Socket)._vptr_Socket[5])(&local_268);
  testing::internal::EqHelper::
  Compare<ot::commissioner::Address,_ot::commissioner::Address,_nullptr>
            ((EqHelper *)local_238,"clientSocket->GetLocalAddr()","serverSocket->GetPeerAddr()",
             &local_250,&local_268);
  Address::~Address(&local_268);
  Address::~Address(&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  iVar2 = (*(peVar4->super_Socket)._vptr_Socket[2])();
  local_28a = (unsigned_short)iVar2;
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  iVar2 = (*(peVar4->super_Socket)._vptr_Socket[4])();
  local_28c = (unsigned_short)iVar2;
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_288,"clientSocket->GetLocalPort()","serverSocket->GetPeerPort()",
             &local_28a,&local_28c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  local_2d8.kHello = (ByteArray *)local_28;
  local_2d8.kWorld = (ByteArray *)local_68;
  local_2d8.serverSocket = (shared_ptr<ot::commissioner::MockSocket> *)local_e8;
  std::function<void(short)>::
  function<ot::commissioner::SocketTest_MockSocketHello_Test::TestBody()::__0,void>
            ((function<void(short)> *)&local_2c0,&local_2d8);
  (*(peVar4->super_Socket)._vptr_Socket[8])(peVar4,&local_2c0);
  std::function<void_(short)>::~function(&local_2c0);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  local_308 = (ByteArray *)local_68;
  local_300 = &gtest_ar.message_;
  _auStack_310 = (__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_c0;
  std::function<void(short)>::
  function<ot::commissioner::SocketTest_MockSocketHello_Test::TestBody()::__1,void>
            ((function<void(short)> *)&local_2f8,(anon_class_24_3_7c1a3049 *)auStack_310);
  (*(peVar4->super_Socket)._vptr_Socket[8])(peVar4,&local_2f8);
  std::function<void_(short)>::~function(&local_2f8);
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = (*(peVar4->super_Socket)._vptr_Socket[6])(peVar4,pvVar5,sVar6);
  local_330 = (unsigned_long)
              gtest_ar_5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_;
  local_338 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_328,"static_cast<size_t>(len)","kHello.size()",&local_330,&local_338)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xfa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_35c = event_base_loop((event_base *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,4);
  local_360 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_358,"event_base_loop(eventBase, 0x04)","0",&local_35c,&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xfc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  event_base_free((event_base *)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  std::shared_ptr<ot::commissioner::MockSocket>::~shared_ptr
            ((shared_ptr<ot::commissioner::MockSocket> *)local_e8);
  std::shared_ptr<ot::commissioner::MockSocket>::~shared_ptr
            ((shared_ptr<ot::commissioner::MockSocket> *)local_c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(SocketTest, MockSocketHello)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};
    const ByteArray kWorld{'w', 'o', 'r', 'l', 'd'};

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    auto clientSocket = std::make_shared<MockSocket>(eventBase, Address::FromString(kClientAddr), kClientPort);
    auto serverSocket = std::make_shared<MockSocket>(eventBase, Address::FromString(kServerAddr), kServerPort);

    clientSocket->Connect(serverSocket);
    serverSocket->Connect(clientSocket);

    EXPECT_TRUE(clientSocket->IsConnected());
    EXPECT_TRUE(serverSocket->IsConnected());

    EXPECT_EQ(clientSocket->GetPeerAddr(), serverSocket->GetLocalAddr());
    EXPECT_EQ(clientSocket->GetPeerPort(), serverSocket->GetLocalPort());
    EXPECT_EQ(clientSocket->GetLocalAddr(), serverSocket->GetPeerAddr());
    EXPECT_EQ(clientSocket->GetLocalPort(), serverSocket->GetPeerPort());

    serverSocket->SetEventHandler([&](short aFlags) {
        if (aFlags & EV_READ)
        {
            uint8_t buf[1024];
            int     len = serverSocket->Receive(buf, sizeof(buf));
            EXPECT_EQ(static_cast<size_t>(len), kHello.size());

            len = serverSocket->Send(&kWorld[0], kWorld.size());
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());
        }
    });
    clientSocket->SetEventHandler([&](short aFlags) {
        if (aFlags & EV_READ)
        {
            uint8_t buf[1024];
            int     len = clientSocket->Receive(buf, sizeof(buf));
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());

            event_base_loopbreak(eventBase);
        }
    });

    int len = clientSocket->Send(&kHello[0], kHello.size());
    EXPECT_EQ(static_cast<size_t>(len), kHello.size());

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}